

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btcp.c
# Opt level: O0

void nn_btcp_destroy(void *self)

{
  long in_RDI;
  nn_btcp *btcp;
  
  if (*(int *)(in_RDI + 0x80) != 1) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(uint *)(in_RDI + 0x80),
            "NN_BTCP_STATE_IDLE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/btcp.c"
            ,0xb6);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_list_term((nn_list *)0x307f32);
  if (*(long *)(in_RDI + 0x2f0) != 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","btcp->atcp == NULL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/btcp.c"
            ,0xb8);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_usock_term((nn_usock *)0x307fa9);
  nn_fsm_term((nn_fsm *)0x307fb3);
  nn_free((void *)0x307fbd);
  return;
}

Assistant:

static void nn_btcp_destroy (void *self)
{
    struct nn_btcp *btcp = self;

    nn_assert_state (btcp, NN_BTCP_STATE_IDLE);
    nn_list_term (&btcp->atcps);
    nn_assert (btcp->atcp == NULL);
    nn_usock_term (&btcp->usock);
    nn_fsm_term (&btcp->fsm);

    nn_free (btcp);
}